

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3dPointListRef *vertex_list,ON_3dVector *FN)

{
  double dVar1;
  bool bVar2;
  ON_3dVector b;
  ON_3dVector a;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  ON_3dPointListRef::operator[](&local_78,vertex_list,this->vi[2]);
  ON_3dPointListRef::operator[](&local_90,vertex_list,this->vi[0]);
  ON_3dPoint::operator-(&local_48,&local_78,&local_90);
  ON_3dPointListRef::operator[](&local_90,vertex_list,this->vi[3]);
  ON_3dPointListRef::operator[](&local_60,vertex_list,this->vi[1]);
  ON_3dPoint::operator-((ON_3dVector *)&local_78,&local_90,&local_60);
  ON_CrossProduct((ON_3dVector *)&local_90,&local_48,(ON_3dVector *)&local_78);
  FN->z = local_90.z;
  FN->x = local_90.x;
  FN->y = local_90.y;
  bVar2 = ON_3dVector::Unitize(FN);
  if (!bVar2) {
    FN->z = ON_3dVector::ZeroVector.z;
    dVar1 = ON_3dVector::ZeroVector.y;
    FN->x = ON_3dVector::ZeroVector.x;
    FN->y = dVar1;
  }
  return bVar2;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const class ON_3dPointListRef& vertex_list, ON_3dVector& FN ) const
{
  ON_3dVector a = vertex_list[vi[2]] - vertex_list[vi[0]];
  ON_3dVector b = vertex_list[vi[3]] - vertex_list[vi[1]];
  FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
  if ( FN.Unitize() )
    return true;

  FN = ON_3dVector::ZeroVector;
  return false;
}